

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_peer_dispatch_incoming_unreliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *excludeCommand;
  ushort uVar1;
  ushort uVar2;
  _ENetListNode *p_Var3;
  _ENetHost *p_Var4;
  _ENetListNode *p_Var5;
  ushort uVar6;
  ENetListIterator last;
  _ENetListNode *p_Var7;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator pEVar8;
  ENetListIterator first;
  ENetListIterator pEVar9;
  int iVar10;
  ENetListIterator last_1;
  ushort uVar11;
  bool bVar12;
  
  excludeCommand = &channel->incomingUnreliableCommands;
  p_Var7 = (channel->incomingUnreliableCommands).sentinel.next;
  pEVar8 = p_Var7;
  pEVar9 = p_Var7;
  if (p_Var7 != &excludeCommand->sentinel) {
    do {
      iVar10 = 4;
      if (((ulong)pEVar8[1].next & 0xf00000000) != 0x900000000) {
        uVar1 = *(ushort *)&pEVar8[1].next;
        uVar2 = channel->incomingReliableSequenceNumber;
        if (uVar1 == uVar2) {
          if (*(int *)&pEVar8[4].previous == 0) {
            channel->incomingUnreliableSequenceNumber = *(uint16_t *)((long)&pEVar8[1].next + 2);
          }
          else {
            if (pEVar9 == pEVar8) {
              if (p_Var7 != pEVar8) {
                p_Var7 = pEVar8->previous;
              }
            }
            else {
              p_Var7 = pEVar8->previous;
              p_Var3 = pEVar9->previous;
              p_Var3->next = p_Var7->next;
              p_Var7->next->previous = p_Var3;
              p_Var3 = (peer->dispatchedCommands).sentinel.previous;
              pEVar9->previous = p_Var3;
              p_Var7->next = &(peer->dispatchedCommands).sentinel;
              p_Var3->next = pEVar9;
              (peer->dispatchedCommands).sentinel.previous = p_Var7;
              p_Var7 = pEVar8;
              if (peer->needsDispatch == 0) {
                p_Var4 = peer->host;
                p_Var3 = (p_Var4->dispatchQueue).sentinel.previous;
                (peer->dispatchList).previous = p_Var3;
                (peer->dispatchList).next = &(p_Var4->dispatchQueue).sentinel;
                p_Var3->next = &peer->dispatchList;
                (p_Var4->dispatchQueue).sentinel.previous = &peer->dispatchList;
                peer->needsDispatch = 1;
              }
            }
LAB_00106675:
            pEVar9 = pEVar8->next;
            iVar10 = 0;
          }
        }
        else {
          uVar6 = uVar2 >> 0xc;
          uVar11 = (uVar1 >> 0xc) + 0x10;
          if (uVar2 <= uVar1) {
            uVar11 = uVar1 >> 0xc;
          }
          bVar12 = (ushort)(uVar6 + 7) <= uVar11;
          iVar10 = 2;
          if (bVar12 || uVar11 < uVar6) {
            p_Var7 = pEVar8->next;
            iVar10 = 0;
            if (pEVar9 != pEVar8) {
              p_Var3 = pEVar8->previous;
              p_Var5 = pEVar9->previous;
              p_Var5->next = p_Var3->next;
              p_Var3->next->previous = p_Var5;
              p_Var5 = (peer->dispatchedCommands).sentinel.previous;
              pEVar9->previous = p_Var5;
              p_Var3->next = &(peer->dispatchedCommands).sentinel;
              p_Var5->next = pEVar9;
              (peer->dispatchedCommands).sentinel.previous = p_Var3;
              if (peer->needsDispatch == 0) {
                p_Var4 = peer->host;
                p_Var3 = (p_Var4->dispatchQueue).sentinel.previous;
                (peer->dispatchList).previous = p_Var3;
                (peer->dispatchList).next = &(p_Var4->dispatchQueue).sentinel;
                p_Var3->next = &peer->dispatchList;
                (p_Var4->dispatchQueue).sentinel.previous = &peer->dispatchList;
                peer->needsDispatch = 1;
              }
            }
          }
          if (bVar12 || uVar11 < uVar6) goto LAB_00106675;
        }
      }
    } while ((iVar10 != 2) && (pEVar8 = pEVar8->next, pEVar8 != &excludeCommand->sentinel));
  }
  if (pEVar9 != pEVar8) {
    p_Var7 = pEVar8->previous;
    p_Var3 = pEVar9->previous;
    p_Var3->next = p_Var7->next;
    p_Var7->next->previous = p_Var3;
    p_Var3 = (peer->dispatchedCommands).sentinel.previous;
    pEVar9->previous = p_Var3;
    p_Var7->next = &(peer->dispatchedCommands).sentinel;
    p_Var3->next = pEVar9;
    (peer->dispatchedCommands).sentinel.previous = p_Var7;
    p_Var7 = pEVar8;
    if (peer->needsDispatch == 0) {
      p_Var4 = peer->host;
      p_Var3 = (p_Var4->dispatchQueue).sentinel.previous;
      (peer->dispatchList).previous = p_Var3;
      (peer->dispatchList).next = &(p_Var4->dispatchQueue).sentinel;
      p_Var3->next = &peer->dispatchList;
      (p_Var4->dispatchQueue).sentinel.previous = &peer->dispatchList;
      peer->needsDispatch = 1;
    }
  }
  enet_peer_remove_incoming_commands
            ((ENetList *)(excludeCommand->sentinel).next,p_Var7,&queuedCommand->incomingCommandList,
             (ENetIncomingCommand *)excludeCommand);
  return;
}

Assistant:

void enet_peer_dispatch_incoming_unreliable_commands(ENetPeer* peer, ENetChannel* channel, ENetIncomingCommand* queuedCommand) {
	ENetListIterator droppedCommand, startCommand, currentCommand;

	for (droppedCommand = startCommand = currentCommand = enet_list_begin(&channel->incomingUnreliableCommands); currentCommand != enet_list_end(&channel->incomingUnreliableCommands); currentCommand = enet_list_next(currentCommand)) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;

		if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED)
			continue;

		if (incomingCommand->reliableSequenceNumber == channel->incomingReliableSequenceNumber) {
			if (incomingCommand->fragmentsRemaining <= 0) {
				channel->incomingUnreliableSequenceNumber = incomingCommand->unreliableSequenceNumber;

				continue;
			}

			if (startCommand != currentCommand) {
				enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

				if (!peer->needsDispatch) {
					enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

					peer->needsDispatch = 1;
				}

				droppedCommand = currentCommand;
			}
			else if (droppedCommand != currentCommand) {
				droppedCommand = enet_list_previous(currentCommand);
			}
		}
		else {
			uint16_t reliableWindow = incomingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
			uint16_t currentWindow = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

			if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber)
				reliableWindow += ENET_PEER_RELIABLE_WINDOWS;

			if (reliableWindow >= currentWindow && reliableWindow < currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1)
				break;

			droppedCommand = enet_list_next(currentCommand);

			if (startCommand != currentCommand) {
				enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

				if (!peer->needsDispatch) {
					enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

					peer->needsDispatch = 1;
				}
			}
		}

		startCommand = enet_list_next(currentCommand);
	}

	if (startCommand != currentCommand) {
		enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

		if (!peer->needsDispatch) {
			enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

			peer->needsDispatch = 1;
		}

		droppedCommand = currentCommand;
	}

	enet_peer_remove_incoming_commands(&channel->incomingUnreliableCommands, enet_list_begin(&channel->incomingUnreliableCommands), droppedCommand, queuedCommand);
}